

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void do_abs(void *x,int n,int type)

{
  float fVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  if (type < -0x66) {
    if (type == -0x133) {
      if (0 < n) {
        uVar5 = 0;
        do {
          dVar2 = *(double *)((long)x + uVar5 * 8);
          uVar9 = -(ulong)(dVar2 < -dVar2);
          *(ulong *)((long)x + uVar5 * 8) = ~uVar9 & (ulong)dVar2 | (ulong)-dVar2 & uVar9;
          uVar5 = uVar5 + 1;
        } while ((uint)n != uVar5);
      }
    }
    else {
      if (type != -0x132) {
LAB_00106600:
        comex_error("unsupported ABS operation",1);
        return;
      }
      if (0 < n) {
        uVar5 = 0;
        do {
          fVar1 = *(float *)((long)x + uVar5 * 4);
          uVar8 = -(uint)(fVar1 < -fVar1);
          *(uint *)((long)x + uVar5 * 4) = ~uVar8 & (uint)fVar1 | (uint)-fVar1 & uVar8;
          uVar5 = uVar5 + 1;
        } while ((uint)n != uVar5);
      }
    }
  }
  else if (type == -0x66) {
    if (0 < n) {
      uVar5 = 0;
      do {
        lVar4 = *(long *)((long)x + uVar5 * 8);
        lVar7 = -lVar4;
        if (0 < lVar4) {
          lVar7 = lVar4;
        }
        *(long *)((long)x + uVar5 * 8) = lVar7;
        uVar5 = uVar5 + 1;
      } while ((uint)n != uVar5);
    }
  }
  else if (type == -0x65) {
    if (0 < n) {
      uVar5 = 0;
      do {
        lVar4 = *(long *)((long)x + uVar5 * 8);
        lVar7 = -lVar4;
        if (0 < lVar4) {
          lVar7 = lVar4;
        }
        *(long *)((long)x + uVar5 * 8) = lVar7;
        uVar5 = uVar5 + 1;
      } while ((uint)n != uVar5);
    }
  }
  else {
    if (type != -99) goto LAB_00106600;
    if (0 < n) {
      uVar5 = 0;
      do {
        iVar3 = *(int *)((long)x + uVar5 * 4);
        iVar6 = -iVar3;
        if (0 < iVar3) {
          iVar6 = iVar3;
        }
        *(int *)((long)x + uVar5 * 4) = iVar6;
        uVar5 = uVar5 + 1;
      } while ((uint)n != uVar5);
    }
  }
  return;
}

Assistant:

static void do_abs(void *x, int n, int type)
{
#define ARMCI_ABS_INT(a)  (((a) >= 0)   ? (a) : (-(a)))
#define ARMCI_ABS_FLT(a)  (((a) >= 0.0) ? (a) : (-(a)))
#define DO_ABS(ARMCI_TYPE, C_TYPE, WHICH)       \
    if (type == ARMCI_TYPE) {                   \
        int i;                                  \
        C_TYPE *y = (C_TYPE *)x;                \
        for (i = 0; i < n; i++) {               \
            y[i] = ARMCI_ABS_##WHICH(y[i]);     \
        }                                       \
    }                                           \
    else
    DO_ABS(ARMCI_INT,       int,        INT)
    DO_ABS(ARMCI_LONG,      long,       INT)
    DO_ABS(ARMCI_LONG_LONG, long long,  INT)
    DO_ABS(ARMCI_FLOAT,     float,      FLT)
    DO_ABS(ARMCI_DOUBLE,    double,     FLT)
    {
        comex_error("unsupported ABS operation", 1);
    }
#undef ARMCI_ABS_INT
#undef ARMCI_ABS_FLT
#undef DO_ABS
}